

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  seed_nodes)

{
  CThreadInterrupt *this_00;
  ConnectionType CVar1;
  long lVar2;
  undefined8 *puVar3;
  CChainParams *pCVar4;
  byte *pbVar5;
  pointer ppCVar6;
  pointer pCVar7;
  AddrMan *pAVar8;
  CService ipIn;
  CService ipIn_00;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  uint16_t port;
  undefined4 uVar13;
  int iVar14;
  Network net;
  int iVar15;
  ulong uVar16;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar17;
  microseconds mVar18;
  microseconds mVar19;
  microseconds mVar20;
  size_t sVar21;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar22;
  duration dVar23;
  time_point tVar24;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar25;
  size_type sVar26;
  duration rel_time;
  uint uVar27;
  long in_RCX;
  char *args;
  long lVar28;
  undefined8 uVar29;
  const_iterator __first;
  uint uVar30;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_> __it;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *__return_storage_ptr__;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *this_01;
  undefined8 *puVar31;
  long lVar32;
  ulong uVar33;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_> _Var34;
  pointer ppCVar35;
  string *strDest;
  undefined8 uVar36;
  long in_FS_OFFSET;
  bool bVar37;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  Span<const_std::byte> sp;
  undefined1 in_stack_fffffffffffffc08 [11];
  undefined1 in_stack_fffffffffffffc13;
  ConnectionType in_stack_fffffffffffffc14;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  uint in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  int local_3b4;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  duration local_390;
  allocator<char> local_351;
  char *local_350;
  undefined1 local_342;
  undefined1 local_341;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_340;
  NodeSeconds addr_last_try;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  reachable_nets;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  optional<Network> preferred_net;
  CSemaphoreGrant grant;
  string local_278;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  CService endpoint;
  undefined2 local_200;
  undefined6 uStack_1fe;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  CService local_1c8;
  FastRandomContext rng;
  string local_118;
  CAddress addrConnect;
  CAddress addr;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rng,false);
  uVar38 = seed_nodes.m_data._0_4_;
  uVar39 = seed_nodes.m_data._4_4_;
  if (((seed_nodes.m_data)->_M_dataplus)._M_p == (pointer)(seed_nodes.m_data)->_M_string_length) {
    tVar17 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                       ();
    mVar18 = RandomMixin<FastRandomContext>::rand_exp_duration
                       (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x7270e00);
    mVar19 = RandomMixin<FastRandomContext>::rand_exp_duration
                       (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
    mVar20 = RandomMixin<FastRandomContext>::rand_exp_duration
                       (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"-dnsseed",(allocator<char> *)&addrConnect);
    bVar10 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"-fixedseeds",(allocator<char> *)&addrConnect);
    bVar9 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"-seednode",(allocator<char> *)&addrConnect);
    bVar11 = ArgsManager::IsArgSet(&gArgs,(string *)&addr);
    std::__cxx11::string::~string((string *)&addr);
    local_390.__r = (rep)NodeClock::now();
    sVar21 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    uVar13 = (undefined4)CONCAT71((int7)(sVar21 >> 8),sVar21 == 0);
    if (!bVar9) {
      logging_function._M_str = "ThreadOpenConnections";
      logging_function._M_len = 0x15;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x9c2,ALL,Info,(ConstevalFormatString<0U>)0x687bc8);
    }
    local_3a0 = mVar18.__r + (long)tVar17.__d.__r;
    local_398 = mVar19.__r + (long)tVar17.__d.__r;
    local_3a8 = mVar20.__r + (long)tVar17.__d.__r;
    uVar27 = CONCAT31((int3)((uint)uVar13 >> 8),(byte)uVar13 & in_RCX != 0);
    this_00 = &this->interruptNet;
    bVar10 = bVar10 | bVar11;
    local_3b0 = in_RCX;
    do {
      bVar11 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar11) break;
      if ((uVar27 & 1) != 0) {
        local_3b0 = local_3b0 + -1;
        strDest = (string *)(local_3b0 * 0x20 + seed_nodes.m_size);
        AddAddrFetch(this,strDest);
        sVar21 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        if (sVar21 == 0) {
          logging_function_01._M_str = "ThreadOpenConnections";
          logging_function_01._M_len = 0x15;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_01._M_len = 0x57;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x9cd,ALL,Info,
                     (ConstevalFormatString<1U>)0x687be2,strDest);
        }
        else {
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0xa;
          logging_function_00._M_str = "ThreadOpenConnections";
          logging_function_00._M_len = 0x15;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_00._M_len = 0x57;
          LogPrintFormatInternal<long,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x9cf,ALL,Info,
                     (ConstevalFormatString<2U>)0x687c14,(long *)&addr,strDest);
        }
      }
      ProcessAddrFetch(this);
      bVar11 = CThreadInterrupt::sleep_for(this_00,(duration)0x1dcd6500);
      if (!bVar11) break;
      PerformReconnections(this);
      grant.sem = (this->semOutbound)._M_t.
                  super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                  super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                  super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      grant.fHaveGrant = false;
      CSemaphoreGrant::Acquire(&grant);
      bVar11 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar11) {
        CSemaphoreGrant::Release(&grant);
        break;
      }
      GetReachableEmptyNetworks(&fixed_seed_networks,this);
      if ((fixed_seed_networks._M_h._M_element_count != 0 & bVar9) == 1) {
        tVar22 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                           ();
        if ((long)tVar22.__d.__r * 1000000 - ((long)tVar17.__d.__r + 60000000) == 0 ||
            (long)tVar22.__d.__r * 1000000 < (long)tVar17.__d.__r + 60000000) {
          bVar9 = true;
          if (bVar10 == 0) {
            UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&addr,&this->m_added_nodes_mutex,
                       "m_added_nodes_mutex",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                       ,0x9ed,false);
            if ((this->m_added_node_params).
                super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this->m_added_node_params).
                super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              logging_function_06._M_str = "ThreadOpenConnections";
              logging_function_06._M_len = 0x15;
              source_file_06._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_06._M_len = 0x57;
              LogPrintFormatInternal<>
                        (logging_function_06,source_file_06,0x9f0,ALL,Info,
                         (ConstevalFormatString<0U>)0x687cea);
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
              goto LAB_0017d7e2;
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
          }
        }
        else {
          logging_function_02._M_str = "ThreadOpenConnections";
          logging_function_02._M_len = 0x15;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_02._M_len = 0x57;
          LogPrintFormatInternal<>
                    (logging_function_02,source_file_02,0x9e8,ALL,Info,
                     (ConstevalFormatString<0U>)0x687c70);
LAB_0017d7e2:
          pCVar4 = this->m_params;
          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FastRandomContext::FastRandomContext((FastRandomContext *)&addr,false);
          pbVar5 = (pCVar4->vFixedSeeds).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sp.m_size = (long)(pCVar4->vFixedSeeds).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
          sp.m_data = pbVar5;
          DataStream::DataStream((DataStream *)&addrConnect,sp);
          lVar28 = addrConnect.super_CService.super_CNetAddr._24_8_;
          reachable_nets._M_h._M_element_count =
               addrConnect.super_CService.super_CNetAddr.m_addr._16_8_;
          uVar36 = addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_;
          uVar29 = addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                   indirect;
          reachable_nets._M_h._M_buckets = (__buckets_ptr)&CAddress::V2_NETWORK;
          reachable_nets._M_h._M_bucket_count =
               (size_type)
               addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
          reachable_nets._M_h._M_before_begin._M_nxt =
               (_Hash_node_base *)addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_;
          addrConnect.super_CService.super_CNetAddr.m_addr._size = 0;
          addrConnect.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)0x0;
          addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
          reachable_nets._M_h._M_rehash_policy._M_max_load_factor =
               (float)addrConnect.super_CService.super_CNetAddr.m_net;
          reachable_nets._M_h._M_rehash_policy._4_4_ =
               addrConnect.super_CService.super_CNetAddr.m_scope_id;
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&addrConnect)
          ;
          while ((_Hash_node_base *)(uVar29 + lVar28) != (_Hash_node_base *)uVar36) {
            CService::CService(&endpoint);
            CService::
            SerializationOps<ParamsStream<DataStream,CAddress::SerParams>,CService,ActionUnserialize>
                      (&endpoint,&reachable_nets);
            CService::CService((CService *)&outbound_ipv46_peer_netgroups,&endpoint);
            ipIn_00.super_CNetAddr.m_addr._union.direct[0xb] = bVar10;
            ipIn_00.super_CNetAddr.m_addr._union._0_11_ = in_stack_fffffffffffffc08;
            ipIn_00.super_CNetAddr.m_addr._union._12_4_ = in_stack_fffffffffffffc14;
            ipIn_00.super_CNetAddr.m_addr._size = uVar38;
            ipIn_00.super_CNetAddr.m_addr._20_4_ = uVar39;
            ipIn_00.super_CNetAddr.m_net = in_stack_fffffffffffffc20;
            ipIn_00.super_CNetAddr.m_scope_id = uVar27;
            ipIn_00._32_4_ = in_stack_fffffffffffffc28;
            ipIn_00._36_4_ = in_stack_fffffffffffffc2c;
            CAddress::CAddress(&addrConnect,ipIn_00,(ServiceFlags)&outbound_ipv46_peer_netgroups);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &outbound_ipv46_peer_netgroups);
            tVar22 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                               ();
            dVar23 = RandomMixin<FastRandomContext>::
                     rand_uniform_duration<std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               ((RandomMixin<FastRandomContext> *)&addr,(duration)0xfffffffffff6c580
                               );
            addrConnect.nTime.__d.__r = (duration)(dVar23.__r + (long)tVar22.__d.__r + -0x93a80);
            bVar9 = ::LogAcceptCategory(NET,Debug);
            if (bVar9) {
              CService::ToStringAddrPort_abi_cxx11_(&local_118,&addrConnect.super_CService);
              logging_function_03._M_str = "ConvertSeeds";
              logging_function_03._M_len = 0xc;
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_03._M_len = 0x57;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_03,source_file_03,0xcf,NET,Debug,
                         (ConstevalFormatString<1U>)0x68875f,&local_118);
              std::__cxx11::string::~string((string *)&local_118);
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&seed_addrs,&addrConnect);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&endpoint);
            uVar29 = reachable_nets._M_h._M_bucket_count;
            uVar36 = reachable_nets._M_h._M_before_begin;
            lVar28 = reachable_nets._M_h._M_rehash_policy._0_8_;
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                     &reachable_nets._M_h._M_bucket_count);
          ChaCha20::~ChaCha20((ChaCha20 *)&addr.super_CService.super_CNetAddr.m_addr._size);
          pCVar7 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)&fixed_seed_networks;
          lVar28 = (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start;
          __it._M_current =
               seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
               super__Vector_impl_data._M_start;
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
          for (lVar32 = lVar28 / 0x38 >> 2; _Var34._M_current = __it._M_current, 0 < lVar32;
              lVar32 = lVar32 + -1) {
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,__it);
            if (bVar9) goto LAB_0017db73;
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,__it._M_current + 1);
            _Var34._M_current = __it._M_current + 1;
            if (bVar9) goto LAB_0017db73;
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,__it._M_current + 2);
            _Var34._M_current = __it._M_current + 2;
            if (bVar9) goto LAB_0017db73;
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,__it._M_current + 3);
            _Var34._M_current = __it._M_current + 3;
            if (bVar9) goto LAB_0017db73;
            __it._M_current = __it._M_current + 4;
            lVar28 = lVar28 + -0xe0;
          }
          lVar28 = lVar28 / 0x38;
          if (lVar28 == 1) {
LAB_0017db5a:
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,__it);
            _Var34._M_current = __it._M_current;
            if (!bVar9) {
              _Var34._M_current = pCVar7;
            }
LAB_0017db73:
            __first._M_current = _Var34._M_current;
            if (_Var34._M_current != pCVar7) {
              while (_Var34._M_current = _Var34._M_current + 1, _Var34._M_current != pCVar7) {
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                        ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                      *)&addrConnect,_Var34);
                if (!bVar9) {
                  CAddress::operator=(__first._M_current,_Var34._M_current);
                  __first._M_current = __first._M_current + 1;
                }
              }
            }
          }
          else {
            if (lVar28 == 2) {
LAB_0017db42:
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                      ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                    *)&addr,__it);
              _Var34._M_current = __it._M_current;
              if (!bVar9) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0017db5a;
              }
              goto LAB_0017db73;
            }
            __first._M_current = pCVar7;
            if (lVar28 == 3) {
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                      ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                    *)&addr,__it);
              if (!bVar9) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0017db42;
              }
              goto LAB_0017db73;
            }
          }
          std::vector<CAddress,_std::allocator<CAddress>_>::erase
                    (&seed_addrs,__first,
                     (const_iterator)
                     seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          CNetAddr::CNetAddr((CNetAddr *)&addr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&addrConnect,"fixedseeds",(allocator<char> *)&reachable_nets);
          CNetAddr::SetInternal((CNetAddr *)&addr,(string *)&addrConnect);
          std::__cxx11::string::~string((string *)&addrConnect);
          AddrMan::Add(this->addrman,&seed_addrs,(CNetAddr *)&addr,(seconds)0x0);
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)(((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x38);
          logging_function_04._M_str = "ThreadOpenConnections";
          logging_function_04._M_len = 0x15;
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_04._M_len = 0x57;
          LogPrintFormatInternal<unsigned_long>
                    (logging_function_04,source_file_04,0xa03,ALL,Info,
                     (ConstevalFormatString<1U>)0x687d71,(unsigned_long *)&addrConnect);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
          std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&seed_addrs);
          bVar9 = false;
        }
      }
      CAddress::CAddress(&addrConnect);
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&endpoint,&this->m_nodes_mutex
                 ,"m_nodes_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                 ,0xa13,false);
      ppCVar35 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar6 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar38 = SUB84(ppCVar6,0);
      uVar39 = (undefined4)((ulong)ppCVar6 >> 0x20);
      local_3b4 = 0;
      in_stack_fffffffffffffc28 = 0;
      uVar30 = 0;
      for (; ppCVar35 != (pointer)CONCAT44(uVar39,uVar38); ppCVar35 = ppCVar35 + 1) {
        CVar1 = (*ppCVar35)->m_conn_type;
        if ((CVar1 < ADDR_FETCH) && ((0x16U >> (CVar1 & 0x1f) & 1) != 0)) {
          CAddress::CAddress(&addr,&(*ppCVar35)->addr);
          if (addr.super_CService.super_CNetAddr.m_net - NET_ONION < 3) {
            local_3b4 = local_3b4 + 1;
          }
          else {
            NetGroupManager::GetGroup
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reachable_nets,
                       this->m_netgroupman,(CNetAddr *)&addr);
            std::
            _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        *)&outbound_ipv46_peer_netgroups,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reachable_nets);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &reachable_nets);
          }
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
        }
        uVar30 = uVar30 + (CVar1 == OUTBOUND_FULL_RELAY);
        in_stack_fffffffffffffc28 = in_stack_fffffffffffffc28 + (CVar1 == BLOCK_RELAY);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&endpoint);
      uVar27 = 0;
      if ((local_3b0 != 0) && (uVar30 < 2)) {
        tVar24 = NodeClock::now();
        if (local_390.__r + 10000000000 < (long)tVar24.__d.__r) {
          uVar27 = 1;
          local_390.__r = (rep)NodeClock::now();
        }
        else {
          uVar27 = 0;
        }
      }
      tVar25 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                         ();
      preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
      super__Optional_payload_base<Network>._M_engaged = false;
      bVar37 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
               super__Vector_impl_data._M_start ==
               (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar14 = this->m_max_outbound_block_relay;
      bVar11 = iVar14 <= (int)in_stack_fffffffffffffc28;
      if (bVar11 || bVar37) {
        if ((int)uVar30 < this->m_max_outbound_full_relay) {
          in_stack_fffffffffffffc14 = OUTBOUND_FULL_RELAY;
          goto LAB_0017de9d;
        }
        if ((int)in_stack_fffffffffffffc28 < iVar14) goto LAB_0017de7a;
        if (((this->m_try_another_outbound_peer)._M_base._M_i & 1U) != 0) {
LAB_0017e44f:
          uVar38 = 0;
          in_stack_fffffffffffffc14 = OUTBOUND_FULL_RELAY;
          goto LAB_0017deaa;
        }
        if ((local_398 < (long)tVar25.__d.__r) &&
           (((this->m_start_extra_block_relay_peers)._M_base._M_i & 1U) != 0)) {
          mVar18 = RandomMixin<FastRandomContext>::rand_exp_duration
                             (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
          local_398 = mVar18.__r + (long)tVar25.__d.__r;
          uVar38 = 0;
          in_stack_fffffffffffffc14 = BLOCK_RELAY;
          goto LAB_0017deaa;
        }
        if (local_3a0 < (long)tVar25.__d.__r) {
          mVar18 = RandomMixin<FastRandomContext>::rand_exp_duration
                             (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x7270e00);
          local_3a0 = mVar18.__r + (long)tVar25.__d.__r;
          uVar38 = (undefined4)CONCAT71((int7)((ulong)local_3a0 >> 8),1);
          in_stack_fffffffffffffc14 = FEELER;
          goto LAB_0017deaa;
        }
        if ((((uVar30 == 8) && (this->m_max_outbound_full_relay == 8)) &&
            (local_3a8 < (long)tVar25.__d.__r)) &&
           (bVar12 = MaybePickPreferredNetwork(this,&preferred_net), bVar12)) {
          mVar18 = RandomMixin<FastRandomContext>::rand_exp_duration
                             (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
          local_3a8 = mVar18.__r + (long)tVar25.__d.__r;
          goto LAB_0017e44f;
        }
        iVar14 = 10;
      }
      else {
LAB_0017de7a:
        in_stack_fffffffffffffc14 = BLOCK_RELAY;
LAB_0017de9d:
        uVar38 = 0;
LAB_0017deaa:
        AddrMan::ResolveCollisions(this->addrman);
        tVar24 = NodeClock::now();
        ReachableNets::All(&reachable_nets,&g_reachable_nets);
        in_stack_fffffffffffffc28 = 0;
        while( true ) {
          __return_storage_ptr__ =
               (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *)&addr;
          bVar12 = CThreadInterrupt::operator_cast_to_bool(this_00);
          if (bVar12) break;
          if ((bVar11 || bVar37) ||
             (pCVar7 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
             (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == pCVar7)) {
            if (in_stack_fffffffffffffc28 == 100) break;
            CAddress::CAddress((CAddress *)&endpoint);
            bVar12 = preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                     super__Optional_payload_base<Network>._M_engaged;
            addr_last_try.__d.__r = (duration)0;
            if ((char)uVar38 == '\0') {
              pAVar8 = this->addrman;
              if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                  super__Optional_payload_base<Network>._M_engaged == true) {
                seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(seed_addrs.
                                       super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       preferred_net.super__Optional_base<Network,_true,_true>.
                                       _M_payload.super__Optional_payload_base<Network>._M_payload.
                                       _M_value);
                std::
                _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_Hashtable<Network_const*>
                          ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&local_340,&seed_addrs,
                           (undefined1 *)
                           ((long)&seed_addrs.
                                   super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                                   super__Vector_impl_data._M_start + 4),0,&local_350,&local_341,
                           &local_342);
                AddrMan::Select(__return_storage_ptr__,pAVar8,false,
                                (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                 *)&local_340);
              }
              else {
                AddrMan::Select(__return_storage_ptr__,pAVar8,false,&reachable_nets);
              }
              local_118._M_dataplus._M_p = (pointer)&addr_last_try;
              local_118._M_string_length = (size_type)&endpoint;
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                           *)&local_118,__return_storage_ptr__);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__)
              ;
              if (bVar12 != false) {
                std::
                _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_340);
              }
              NetGroupManager::GetGroup
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         __return_storage_ptr__,this->m_netgroupman,&endpoint.super_CNetAddr);
              sVar26 = std::
                       set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::count(&outbound_ipv46_peer_netgroups,(key_type *)__return_storage_ptr__);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         __return_storage_ptr__);
              if (sVar26 == 0) goto LAB_0017e1f0;
            }
            else {
              AddrMan::SelectTriedCollision(__return_storage_ptr__,this->addrman);
              local_118._M_dataplus._M_p = (pointer)&addr_last_try;
              local_118._M_string_length = (size_type)&endpoint;
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                           *)&local_118,__return_storage_ptr__);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__)
              ;
              bVar12 = CNetAddr::IsValid(&endpoint.super_CNetAddr);
              if (bVar12) {
                bVar12 = AlreadyConnectedToAddress(this,(CAddress *)&endpoint);
                if (!bVar12) goto LAB_0017e1f0;
                pAVar8 = this->addrman;
                tVar22 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                                   ();
                AddrMan::Good(pAVar8,&endpoint,(NodeSeconds)tVar22.__d.__r);
                AddrMan::Select(__return_storage_ptr__,this->addrman,true,&reachable_nets);
              }
              else {
                AddrMan::Select(__return_storage_ptr__,this->addrman,true,&reachable_nets);
              }
              local_118._M_dataplus._M_p = (pointer)&addr_last_try;
              local_118._M_string_length = (size_type)&endpoint;
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                           *)&local_118,__return_storage_ptr__);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__)
              ;
LAB_0017e1f0:
              bVar12 = CNetAddr::IsValid(&endpoint.super_CNetAddr);
              if ((!bVar12) || (bVar12 = IsLocal(&endpoint), bVar12)) {
LAB_0017e5f9:
                this_01 = (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&endpoint;
                goto LAB_0017e601;
              }
              bVar12 = ReachableNets::Contains(&g_reachable_nets,&endpoint.super_CNetAddr);
              if ((bVar12) &&
                 (599999999999 < (long)addr_last_try.__d.__r * -1000000000 + (long)tVar24.__d.__r ||
                  0x1c < in_stack_fffffffffffffc28)) {
                if ((char)uVar38 == '\0') {
                  iVar14 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                     (this->m_msgproc,CONCAT62(uStack_1fe,local_200));
                  if ((char)iVar14 != '\0') goto LAB_0017e2a3;
                }
                else if ((local_200 & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NONE) {
LAB_0017e2a3:
                  if ((in_stack_fffffffffffffc28 < 0x31) &&
                     (endpoint.super_CNetAddr.m_net - NET_IPV4 < 2)) {
                    port = CService::GetPort(&endpoint);
                    bVar12 = IsBadPort(port);
                    if (bVar12) goto LAB_0017e262;
                  }
                  bVar12 = AddedNodesContain(this,(CAddress *)&endpoint);
                  if (!bVar12) {
                    CAddress::operator=(&addrConnect,(CAddress *)&endpoint);
                    goto LAB_0017e5f9;
                  }
                  bVar12 = ::LogAcceptCategory(NET,Debug);
                  if (bVar12) {
                    local_350 = "";
                    args = "network-specific ";
                    if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                        super__Optional_payload_base<Network>._M_engaged != false) {
                      local_350 = "network-specific ";
                    }
                    ConnectionTypeAsString_abi_cxx11_
                              ((string *)__return_storage_ptr__,in_stack_fffffffffffffc14);
                    net = CNetAddr::GetNetwork(&endpoint.super_CNetAddr);
                    GetNetworkName_abi_cxx11_(&local_118,net);
                    bVar12 = fLogIPs;
                    if (fLogIPs == true) {
                      CService::ToStringAddrPort_abi_cxx11_(&local_278,&endpoint);
                      tinyformat::format<std::__cxx11::string>
                                ((string *)&seed_addrs,(tinyformat *)0x68519b,(char *)&local_278,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)args);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&seed_addrs,"",&local_351);
                    }
                    logging_function_05._M_str = "ThreadOpenConnections";
                    logging_function_05._M_len = 0x15;
                    source_file_05._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                    ;
                    source_file_05._M_len = 0x57;
                    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                              (logging_function_05,source_file_05,0xae6,NET,Debug,
                               (ConstevalFormatString<4U>)0x687dcb,&local_350,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &addr,&local_118,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &seed_addrs);
                    std::__cxx11::string::~string((string *)&seed_addrs);
                    if (bVar12 != false) {
                      std::__cxx11::string::~string((string *)&local_278);
                    }
                    std::__cxx11::string::~string((string *)&local_118);
                    std::__cxx11::string::~string((string *)&addr);
                  }
                }
              }
            }
LAB_0017e262:
            in_stack_fffffffffffffc28 = in_stack_fffffffffffffc28 + 1;
            __return_storage_ptr__ =
                 (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  *)&endpoint;
          }
          else {
            CAddress::CAddress((CAddress *)__return_storage_ptr__,pCVar7 + -1);
            std::vector<CAddress,_std::allocator<CAddress>_>::pop_back(&this->m_anchors);
            bVar12 = CNetAddr::IsValid((CNetAddr *)__return_storage_ptr__);
            if ((((bVar12) && (bVar12 = IsLocal((CService *)__return_storage_ptr__), !bVar12)) &&
                (bVar12 = ReachableNets::Contains
                                    (&g_reachable_nets,(CNetAddr *)__return_storage_ptr__), bVar12))
               && (iVar14 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                      (this->m_msgproc,addr.nServices), (char)iVar14 != '\0')) {
              NetGroupManager::GetGroup
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&endpoint,
                         this->m_netgroupman,(CNetAddr *)__return_storage_ptr__);
              sVar26 = std::
                       set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::count(&outbound_ipv46_peer_netgroups,(key_type *)&endpoint);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&endpoint);
              if (sVar26 == 0) {
                CAddress::operator=(&addrConnect,(CAddress *)__return_storage_ptr__);
                bVar11 = ::LogAcceptCategory(NET,Debug);
                this_01 = __return_storage_ptr__;
                if (bVar11) {
                  CService::ToStringAddrPort_abi_cxx11_
                            ((string *)&endpoint,&addrConnect.super_CService);
                  logging_function_07._M_str = "ThreadOpenConnections";
                  logging_function_07._M_len = 0x15;
                  source_file_07._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ;
                  source_file_07._M_len = 0x57;
                  LogPrintFormatInternal<std::__cxx11::string>
                            (logging_function_07,source_file_07,0xa93,NET,Debug,
                             (ConstevalFormatString<1U>)0x687da0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &endpoint);
                  std::__cxx11::string::~string((string *)&endpoint);
                }
LAB_0017e601:
                prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this_01);
                break;
              }
            }
          }
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__);
        }
        bVar11 = CNetAddr::IsValid((CNetAddr *)&addrConnect);
        iVar14 = 0;
        if (bVar11) {
          if ((char)uVar38 != '\0') {
            rel_time = RandomMixin<FastRandomContext>::
                       rand_uniform_duration<std::chrono::_V2::steady_clock>
                                 (&rng.super_RandomMixin<FastRandomContext>,(duration)0x3b9aca00);
            bVar11 = CThreadInterrupt::sleep_for(this_00,rel_time);
            iVar14 = 1;
            if (!bVar11) goto LAB_0017e795;
            bVar11 = ::LogAcceptCategory(NET,Debug);
            if (bVar11) {
              CService::ToStringAddrPort_abi_cxx11_
                        ((string *)__return_storage_ptr__,&addrConnect.super_CService);
              logging_function_08._M_str = "ThreadOpenConnections";
              logging_function_08._M_len = 0x15;
              source_file_08._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_08._M_len = 0x57;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_08,source_file_08,0xaf4,NET,Debug,
                         (ConstevalFormatString<1U>)0x687e39,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__);
              std::__cxx11::string::~string((string *)__return_storage_ptr__);
            }
          }
          if ((preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
               super__Optional_payload_base<Network>._M_engaged == true) &&
             (bVar11 = ::LogAcceptCategory(NET,Debug), bVar11)) {
            CService::ToStringAddrPort_abi_cxx11_
                      ((string *)__return_storage_ptr__,&addrConnect.super_CService);
            GetNetworkName_abi_cxx11_
                      ((string *)&endpoint,
                       preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                       super__Optional_payload_base<Network>._M_payload._M_value);
            logging_function_09._M_str = "ThreadOpenConnections";
            logging_function_09._M_len = 0x15;
            source_file_09._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_09._M_len = 0x57;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_09,source_file_09,0xaf7,NET,Debug,
                       (ConstevalFormatString<2U>)0x687e59,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &endpoint);
            std::__cxx11::string::~string((string *)&endpoint);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
          }
          iVar15 = this->m_max_automatic_connections;
          if (2 < iVar15) {
            iVar15 = 3;
          }
          iVar14 = 0;
          OpenNetworkConnection
                    (this,&addrConnect,
                     iVar15 + -1 <=
                     local_3b4 +
                     (int)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,&grant,(char *)0x0,in_stack_fffffffffffffc14,
                     (bool)((byte)((uint)((int)(this->nLocalServices)._M_i &
                                         (undefined4)addrConnect.nServices) >> 0xb) & 1));
        }
LAB_0017e795:
        std::
        _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&reachable_nets._M_h);
      }
      std::
      _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~_Rb_tree(&outbound_ipv46_peer_netgroups._M_t);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect);
      std::
      _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&fixed_seed_networks._M_h);
      CSemaphoreGrant::Release(&grant);
    } while ((iVar14 == 0) || (iVar14 == 10));
  }
  else {
    uVar16 = 0;
    uVar27 = (uint)((this->nLocalServices)._M_i >> 0xb) & 1;
    uVar13 = 0;
    while( true ) {
      uVar33 = 10;
      if (uVar16 < 10) {
        uVar33 = uVar16;
      }
      puVar3 = (undefined8 *)((undefined8 *)CONCAT44(uVar39,uVar38))[1];
      for (puVar31 = *(undefined8 **)CONCAT44(uVar39,uVar38); puVar31 != puVar3;
          puVar31 = puVar31 + 4) {
        CService::CService(&local_1c8);
        ipIn.super_CNetAddr.m_addr._union.direct[0xb] = in_stack_fffffffffffffc13;
        ipIn.super_CNetAddr.m_addr._union._0_11_ = in_stack_fffffffffffffc08;
        ipIn.super_CNetAddr.m_addr._union._12_4_ = in_stack_fffffffffffffc14;
        ipIn.super_CNetAddr.m_addr._size = uVar38;
        ipIn.super_CNetAddr.m_addr._20_4_ = uVar39;
        ipIn.super_CNetAddr.m_net = in_stack_fffffffffffffc20;
        ipIn.super_CNetAddr.m_scope_id = in_stack_fffffffffffffc24;
        ipIn._32_4_ = uVar27;
        ipIn._36_4_ = uVar13;
        CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_1c8);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8);
        addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)0x0;
        addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ =
             addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        OpenNetworkConnection
                  (this,&addr,false,(CSemaphoreGrant *)&addrConnect,(char *)*puVar31,MANUAL,
                   SUB41(uVar27,0));
        CSemaphoreGrant::Release((CSemaphoreGrant *)&addrConnect);
        lVar28 = uVar33 + 1;
        while (lVar28 = lVar28 + -1, lVar28 != 0) {
          bVar9 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
          if (!bVar9) {
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
            goto LAB_0017d41c;
          }
        }
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
      }
      bVar9 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar9) break;
      PerformReconnections(this);
      uVar16 = uVar16 + 1;
    }
  }
LAB_0017d41c:
  ChaCha20::~ChaCha20(&rng.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        const auto reachable_nets{g_reachable_nets.All()};

        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = preferred_net.has_value()
                    ? addrman.Select(false, {*preferred_net})
                    : addrman.Select(false, reachable_nets);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}